

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

void __thiscall QOpenGLTexturePrivate::setWrapMode(QOpenGLTexturePrivate *this,WrapMode mode)

{
  QOpenGLTextureHelper *pQVar1;
  code *UNRECOVERED_JUMPTABLE;
  BindingTarget BVar2;
  Target TVar3;
  GLuint GVar4;
  long *plVar5;
  undefined8 uVar6;
  
  TVar3 = this->target;
  if ((int)TVar3 < 0x8c18) {
    if ((int)TVar3 < 0x806f) {
      if (TVar3 == Target1D) goto LAB_001578d0;
      if (TVar3 != Target2D) {
        return;
      }
    }
    else {
      if (TVar3 == Target3D) {
        this->wrapModes[2] = mode;
        this->wrapModes[1] = mode;
        this->wrapModes[0] = mode;
        pQVar1 = this->texFuncs;
        UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameteri;
        plVar5 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x10);
        if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
          UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar5 + -1);
        }
        (*UNRECOVERED_JUMPTABLE)(plVar5,this->textureId,0x806f,this->bindingTarget,0x2802,mode);
        pQVar1 = this->texFuncs;
        UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameteri;
        plVar5 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x10);
        if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
          UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar5 + -1);
        }
        (*UNRECOVERED_JUMPTABLE)
                  (plVar5,this->textureId,this->target,this->bindingTarget,0x2803,mode);
        pQVar1 = this->texFuncs;
        GVar4 = this->textureId;
        TVar3 = this->target;
        BVar2 = this->bindingTarget;
        UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameteri;
        plVar5 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x10);
        if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
          UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar5 + -1);
        }
        uVar6 = 0x8072;
        goto LAB_0015799e;
      }
      if ((TVar3 != TargetRectangle) && (TVar3 != TargetCubeMap)) {
        return;
      }
    }
  }
  else {
    if ((int)TVar3 < 0x9009) {
      if (TVar3 != Target1DArray) {
        if (TVar3 == Target2DArray) goto LAB_00157868;
        if (TVar3 != TargetBuffer) {
          return;
        }
      }
LAB_001578d0:
      this->wrapModes[0] = mode;
      pQVar1 = this->texFuncs;
      BVar2 = this->bindingTarget;
      GVar4 = this->textureId;
      UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameteri;
      plVar5 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x10);
      if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
        UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar5 + -1);
      }
      uVar6 = 0x2802;
      goto LAB_0015799e;
    }
    if (((TVar3 != TargetCubeMapArray) && (TVar3 != Target2DMultisample)) &&
       (TVar3 != Target2DMultisampleArray)) {
      return;
    }
  }
LAB_00157868:
  this->wrapModes[1] = mode;
  this->wrapModes[0] = mode;
  pQVar1 = this->texFuncs;
  UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameteri;
  plVar5 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x10);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar5 + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(plVar5,this->textureId,TVar3,this->bindingTarget,0x2802,mode);
  pQVar1 = this->texFuncs;
  GVar4 = this->textureId;
  TVar3 = this->target;
  BVar2 = this->bindingTarget;
  UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameteri;
  plVar5 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x10);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar5 + -1);
  }
  uVar6 = 0x2803;
LAB_0015799e:
  (*UNRECOVERED_JUMPTABLE)(plVar5,GVar4,TVar3,BVar2,uVar6,mode);
  return;
}

Assistant:

void QOpenGLTexturePrivate::setWrapMode(QOpenGLTexture::WrapMode mode)
{
    switch (target) {
    case QOpenGLTexture::Target1D:
    case QOpenGLTexture::Target1DArray:
    case QOpenGLTexture::TargetBuffer:
        wrapModes[0] = mode;
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_S, mode);
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::Target2DArray:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetCubeMapArray:
    case QOpenGLTexture::Target2DMultisample:
    case QOpenGLTexture::Target2DMultisampleArray:
    case QOpenGLTexture::TargetRectangle:
        wrapModes[0] = wrapModes[1] = mode;
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_S, mode);
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_T, mode);
        break;

    case QOpenGLTexture::Target3D:
        wrapModes[0] = wrapModes[1] = wrapModes[2] = mode;
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_S, mode);
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_T, mode);
        texFuncs->glTextureParameteri(textureId, target, bindingTarget, GL_TEXTURE_WRAP_R, mode);
        break;
    }
}